

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int DisconnectHokuyox(HOKUYO *pHokuyo)

{
  int iVar1;
  int local_1c;
  int res;
  int id;
  HOKUYO *pHokuyo_local;
  
  local_1c = 0;
  do {
    if ((HOKUYO *)addrsHokuyo[local_1c] == pHokuyo) {
      iVar1 = DisconnectHokuyo(pHokuyo);
      if (iVar1 != 0) {
        return iVar1;
      }
      addrsHokuyo[local_1c] = (void *)0x0;
      return 0;
    }
    local_1c = local_1c + 1;
  } while (local_1c < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int DisconnectHokuyox(HOKUYO* pHokuyo)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsHokuyo[id] != pHokuyo)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = DisconnectHokuyo(pHokuyo);
	if (res != EXIT_SUCCESS) return res;

	addrsHokuyo[id] = NULL;

	return EXIT_SUCCESS;
}